

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnsynchedPipe.h
# Opt level: O3

void __thiscall
teetime::
UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~UnsynchedPipe(UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  undefined1 *puVar1;
  
  (this->
  super_Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_AbstractPipe._vptr_AbstractPipe = (_func_int **)&PTR__UnsynchedPipe_00149520;
  if ((this->m_value).m_hasValue == true) {
    puVar1 = *(undefined1 **)(this->m_value).m_buffer;
    if (puVar1 != (this->m_value).m_buffer + 0x10) {
      operator_delete(puVar1);
    }
    (this->m_value).m_hasValue = false;
  }
  return;
}

Assistant:

explicit UnsynchedPipe(AbstractStage* targetStage)
     : m_targetStage(targetStage)
    {
    }